

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O1

int CmdCommandHistory(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (argc <= globalUtilOptind + 1) {
      iVar1 = 0x14;
      if (globalUtilOptind + 1 == argc) {
        iVar1 = atoi(argv[globalUtilOptind]);
      }
      pVVar2 = pAbc->aHistory;
      iVar3 = pVVar2->nSize;
      uVar5 = iVar3 - iVar1;
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      if (iVar3 <= (int)uVar5) {
        return 0;
      }
      uVar4 = (ulong)uVar5;
      iVar1 = -uVar5;
      do {
        fprintf((FILE *)pAbc->Out,"%2d : %s\n",(ulong)(uint)(iVar3 + iVar1),pVVar2->pArray[uVar4]);
        uVar4 = uVar4 + 1;
        pVVar2 = pAbc->aHistory;
        iVar3 = pVVar2->nSize;
        iVar1 = iVar1 + -1;
      } while ((int)uVar4 < iVar3);
      return 0;
    }
  }
  fwrite("usage: history [-h] <num>\n",0x1a,1,(FILE *)pAbc->Err);
  fwrite("\t        lists the last commands entered on the command line\n",0x3d,1,(FILE *)pAbc->Err)
  ;
  fwrite("\t-h    : print the command usage\n",0x21,1,(FILE *)pAbc->Err);
  fprintf((FILE *)pAbc->Err,"\t<num> : the maximum number of entries to show [default = %d]\n",0x14)
  ;
  return 1;
}

Assistant:

int CmdCommandHistory( Abc_Frame_t * pAbc, int argc, char **argv )
{
    char * pName;
    int i, c;
    int nPrints = 20;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
            case 'h':
                goto usage;
            default :
                goto usage;
        }
    }
    if ( argc > globalUtilOptind + 1 )
        goto usage;
    // get the number from the command line
    if ( argc == globalUtilOptind + 1 )
        nPrints = atoi(argv[globalUtilOptind]);
    // print the commands
    Vec_PtrForEachEntryStart( char *, pAbc->aHistory, pName, i, Abc_MaxInt(0, Vec_PtrSize(pAbc->aHistory)-nPrints) )
        fprintf( pAbc->Out, "%2d : %s\n", Vec_PtrSize(pAbc->aHistory)-i, pName );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: history [-h] <num>\n" );
    fprintf( pAbc->Err, "\t        lists the last commands entered on the command line\n" );
    fprintf( pAbc->Err, "\t-h    : print the command usage\n" );
    fprintf( pAbc->Err, "\t<num> : the maximum number of entries to show [default = %d]\n", nPrints );
    return ( 1 );
}